

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O2

void cos1D_testSaveLoadAndParamHandling<IMLE>(IMLE *imleObj)

{
  Param *this;
  ostream *poVar1;
  allocator local_d9;
  string local_d8;
  Param param;
  
  this = &imleObj->param;
  IMLE::Param::Param(&param,this);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t-- Initial parameters: --");
  std::endl<char,std::char_traits<char>>(poVar1);
  IMLE::Param::display(this,(ostream *)&std::cout);
  std::__cxx11::string::string((string *)&local_d8,"cos1D.xml",&local_d9);
  IMLE::loadParameters(imleObj,&local_d8);
  std::__cxx11::string::_M_dispose();
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\t-- Now the IMLE object has default parameters: --");
  std::endl<char,std::char_traits<char>>(poVar1);
  IMLE::Param::display(this,(ostream *)&std::cout);
  IMLE::setParameters(imleObj,&param);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t-- Reverting to initial parameters: --");
  std::endl<char,std::char_traits<char>>(poVar1);
  IMLE::Param::display(this,(ostream *)&std::cout);
  cos1D_train<IMLE>(imleObj,10);
  cos1D_display<IMLE>(imleObj);
  std::__cxx11::string::string((string *)&local_d8,"cos1D_demo.imle",&local_d9);
  IMLE::save(imleObj,&local_d8);
  std::__cxx11::string::_M_dispose();
  IMLE::reset(imleObj);
  operator<<((ostream *)&std::cout,imleObj);
  cos1D_train<IMLE>(imleObj,0x14);
  cos1D_display<IMLE>(imleObj);
  std::__cxx11::string::string((string *)&local_d8,"cos1D_demo.imle",&local_d9);
  IMLE::load(imleObj,&local_d8);
  std::__cxx11::string::_M_dispose();
  operator<<((ostream *)&std::cout,imleObj);
  IMLE::Param::~Param(&param);
  return;
}

Assistant:

void cos1D_testSaveLoadAndParamHandling( Learner &imleObj )
{
	// Parameter handling
	typename Learner::Param param = imleObj.getParameters();
	cout << "\t-- Initial parameters: --" << endl;
	imleObj.displayParameters();

	imleObj.loadParameters("cos1D.xml");
	cout << "\t-- Now the IMLE object has default parameters: --" << endl;
	imleObj.displayParameters();

	imleObj.setParameters(param);
	cout << "\t-- Reverting to initial parameters: --" << endl;
	imleObj.displayParameters();

	// Training (10 points)
    cos1D_train(imleObj, 10);

    // Display info
    cos1D_display(imleObj);

    // Save
    imleObj.save("cos1D_demo.imle");

    // Reset
    imleObj.reset();
    cout << imleObj;

    // Train again
    cos1D_train(imleObj, 20);
    cos1D_display(imleObj);

    // Load
    imleObj.load("cos1D_demo.imle");
    cout << imleObj;
}